

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx::DiscMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  uint uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar32;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar49 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  float fVar68;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  Primitive *local_2f8;
  RTCFilterFunctionNArguments local_2f0;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar50 [64];
  undefined1 auVar69 [64];
  
  pSVar6 = context->scene;
  pGVar7 = (pSVar6->geometries).items[Disc->sharedGeomID].ptr;
  lVar21 = *(long *)&pGVar7->field_0x58;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar24._16_16_ = *(undefined1 (*) [16])(lVar21 + (Disc->primIDs).field_0.i[4] * _Var8);
  auVar24._0_16_ = *(undefined1 (*) [16])(lVar21 + (Disc->primIDs).field_0.i[0] * _Var8);
  auVar29._16_16_ = *(undefined1 (*) [16])(lVar21 + (Disc->primIDs).field_0.i[5] * _Var8);
  auVar29._0_16_ = *(undefined1 (*) [16])(lVar21 + (Disc->primIDs).field_0.i[1] * _Var8);
  auVar31._16_16_ = *(undefined1 (*) [16])(lVar21 + (Disc->primIDs).field_0.i[6] * _Var8);
  auVar31._0_16_ = *(undefined1 (*) [16])(lVar21 + (Disc->primIDs).field_0.i[2] * _Var8);
  auVar33._16_16_ = *(undefined1 (*) [16])(lVar21 + (Disc->primIDs).field_0.i[7] * _Var8);
  auVar33._0_16_ = *(undefined1 (*) [16])(lVar21 + (Disc->primIDs).field_0.i[3] * _Var8);
  auVar25 = vunpcklps_avx(auVar24,auVar31);
  auVar11 = vunpckhps_avx(auVar24,auVar31);
  auVar12 = vunpcklps_avx(auVar29,auVar33);
  auVar33 = vunpckhps_avx(auVar29,auVar33);
  auVar24 = vunpcklps_avx(auVar25,auVar12);
  auVar12 = vunpckhps_avx(auVar25,auVar12);
  auVar31 = vunpcklps_avx(auVar11,auVar33);
  local_250 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  local_260 = local_250;
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar25._16_4_ = uVar1;
  auVar25._20_4_ = uVar1;
  auVar25._24_4_ = uVar1;
  auVar25._28_4_ = uVar1;
  auVar24 = vsubps_avx(auVar24,auVar25);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  auVar57._16_4_ = uVar1;
  auVar57._20_4_ = uVar1;
  auVar57._24_4_ = uVar1;
  auVar57._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar61._4_4_ = uVar1;
  auVar61._0_4_ = uVar1;
  auVar61._8_4_ = uVar1;
  auVar61._12_4_ = uVar1;
  auVar61._16_4_ = uVar1;
  auVar61._20_4_ = uVar1;
  auVar61._24_4_ = uVar1;
  auVar61._28_4_ = uVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x80);
  fVar3 = *(float *)(ray + k * 4 + 0xa0);
  fVar4 = *(float *)(ray + k * 4 + 0xc0);
  auVar66 = ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3 + fVar4 * fVar4));
  auVar66 = vshufps_avx(auVar66,auVar66,0);
  auVar67._16_16_ = auVar66;
  auVar67._0_16_ = auVar66;
  auVar25 = vrcpps_avx(auVar67);
  auVar29 = vsubps_avx(auVar12,auVar57);
  auVar31 = vsubps_avx(auVar31,auVar61);
  auVar58._8_4_ = 0x3f800000;
  auVar58._0_8_ = &DAT_3f8000003f800000;
  auVar58._12_4_ = 0x3f800000;
  auVar58._16_4_ = 0x3f800000;
  auVar58._20_4_ = 0x3f800000;
  auVar58._24_4_ = 0x3f800000;
  auVar58._28_4_ = 0x3f800000;
  fVar68 = auVar25._0_4_;
  fVar70 = auVar25._4_4_;
  auVar12._4_4_ = fVar70 * auVar66._4_4_;
  auVar12._0_4_ = fVar68 * auVar66._0_4_;
  fVar71 = auVar25._8_4_;
  auVar12._8_4_ = fVar71 * auVar66._8_4_;
  fVar72 = auVar25._12_4_;
  auVar12._12_4_ = fVar72 * auVar66._12_4_;
  fVar73 = auVar25._16_4_;
  auVar12._16_4_ = fVar73 * auVar66._0_4_;
  fVar74 = auVar25._20_4_;
  auVar12._20_4_ = fVar74 * auVar66._4_4_;
  fVar75 = auVar25._24_4_;
  auVar12._24_4_ = fVar75 * auVar66._8_4_;
  auVar12._28_4_ = uVar1;
  auVar12 = vsubps_avx(auVar58,auVar12);
  fVar48 = auVar31._0_4_;
  fVar51 = auVar31._4_4_;
  fVar52 = auVar31._8_4_;
  fVar53 = auVar31._12_4_;
  fVar54 = auVar31._16_4_;
  fVar55 = auVar31._20_4_;
  fVar56 = auVar31._24_4_;
  fVar41 = auVar29._0_4_;
  fVar42 = auVar29._4_4_;
  fVar43 = auVar29._8_4_;
  fVar44 = auVar29._12_4_;
  fVar45 = auVar29._16_4_;
  fVar46 = auVar29._20_4_;
  fVar47 = auVar29._24_4_;
  fVar32 = auVar24._0_4_;
  fVar35 = auVar24._4_4_;
  fVar36 = auVar24._8_4_;
  fVar37 = auVar24._12_4_;
  fVar38 = auVar24._16_4_;
  fVar39 = auVar24._20_4_;
  fVar40 = auVar24._24_4_;
  fVar68 = (fVar32 * fVar2 + fVar41 * fVar3 + fVar48 * fVar4) * (fVar68 + fVar68 * auVar12._0_4_);
  fVar70 = (fVar35 * fVar2 + fVar42 * fVar3 + fVar51 * fVar4) * (fVar70 + fVar70 * auVar12._4_4_);
  local_200._4_4_ = fVar70;
  local_200._0_4_ = fVar68;
  fVar71 = (fVar36 * fVar2 + fVar43 * fVar3 + fVar52 * fVar4) * (fVar71 + fVar71 * auVar12._8_4_);
  local_200._8_4_ = fVar71;
  fVar72 = (fVar37 * fVar2 + fVar44 * fVar3 + fVar53 * fVar4) * (fVar72 + fVar72 * auVar12._12_4_);
  local_200._12_4_ = fVar72;
  fVar73 = (fVar38 * fVar2 + fVar45 * fVar3 + fVar54 * fVar4) * (fVar73 + fVar73 * auVar12._16_4_);
  local_200._16_4_ = fVar73;
  fVar74 = (fVar39 * fVar2 + fVar46 * fVar3 + fVar55 * fVar4) * (fVar74 + fVar74 * auVar12._20_4_);
  local_200._20_4_ = fVar74;
  fVar75 = (fVar40 * fVar2 + fVar47 * fVar3 + fVar56 * fVar4) * (fVar75 + fVar75 * auVar12._24_4_);
  local_200._24_4_ = fVar75;
  local_200._28_4_ = auVar25._28_4_;
  auVar69 = ZEXT3264(local_200);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar59._4_4_ = uVar1;
  auVar59._0_4_ = uVar1;
  auVar59._8_4_ = uVar1;
  auVar59._12_4_ = uVar1;
  auVar59._16_4_ = uVar1;
  auVar59._20_4_ = uVar1;
  auVar59._24_4_ = uVar1;
  auVar59._28_4_ = uVar1;
  auVar25 = vcmpps_avx(auVar59,local_200,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar62._4_4_ = uVar1;
  auVar62._0_4_ = uVar1;
  auVar62._8_4_ = uVar1;
  auVar62._12_4_ = uVar1;
  auVar62._16_4_ = uVar1;
  auVar62._20_4_ = uVar1;
  auVar62._24_4_ = uVar1;
  auVar62._28_4_ = uVar1;
  auVar12 = vcmpps_avx(local_200,auVar62,2);
  auVar25 = vandps_avx(auVar25,auVar12);
  auVar66 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar63._16_16_ = auVar66;
  auVar63._0_16_ = auVar66;
  auVar12 = vcvtdq2ps_avx(auVar63);
  auVar12 = vcmpps_avx(_DAT_02020f40,auVar12,1);
  auVar57 = auVar12 & auVar25;
  if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar57 >> 0x7f,0) != '\0') ||
        (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar57 >> 0xbf,0) != '\0') ||
      (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar57[0x1f] < '\0') {
    auVar25 = vandps_avx(auVar25,auVar12);
    auVar57 = vunpckhps_avx(auVar11,auVar33);
    auVar11._4_4_ = fVar70 * fVar2;
    auVar11._0_4_ = fVar68 * fVar2;
    auVar11._8_4_ = fVar71 * fVar2;
    auVar11._12_4_ = fVar72 * fVar2;
    auVar11._16_4_ = fVar73 * fVar2;
    auVar11._20_4_ = fVar74 * fVar2;
    auVar11._24_4_ = fVar75 * fVar2;
    auVar11._28_4_ = auVar33._28_4_;
    auVar13._4_4_ = fVar70 * fVar3;
    auVar13._0_4_ = fVar68 * fVar3;
    auVar13._8_4_ = fVar71 * fVar3;
    auVar13._12_4_ = fVar72 * fVar3;
    auVar13._16_4_ = fVar73 * fVar3;
    auVar13._20_4_ = fVar74 * fVar3;
    auVar13._24_4_ = fVar75 * fVar3;
    auVar13._28_4_ = auVar12._28_4_;
    auVar17._4_4_ = fVar70 * fVar4;
    auVar17._0_4_ = fVar68 * fVar4;
    auVar17._8_4_ = fVar71 * fVar4;
    auVar17._12_4_ = fVar72 * fVar4;
    auVar17._16_4_ = fVar73 * fVar4;
    auVar17._20_4_ = fVar74 * fVar4;
    auVar17._24_4_ = fVar75 * fVar4;
    auVar17._28_4_ = DAT_02020f40._28_4_;
    auVar12 = vsubps_avx(auVar24,auVar11);
    auVar11 = vsubps_avx(auVar29,auVar13);
    auVar33 = vsubps_avx(auVar31,auVar17);
    auVar64._0_4_ =
         auVar11._0_4_ * auVar11._0_4_ + auVar33._0_4_ * auVar33._0_4_ +
         auVar12._0_4_ * auVar12._0_4_;
    auVar64._4_4_ =
         auVar11._4_4_ * auVar11._4_4_ + auVar33._4_4_ * auVar33._4_4_ +
         auVar12._4_4_ * auVar12._4_4_;
    auVar64._8_4_ =
         auVar11._8_4_ * auVar11._8_4_ + auVar33._8_4_ * auVar33._8_4_ +
         auVar12._8_4_ * auVar12._8_4_;
    auVar64._12_4_ =
         auVar11._12_4_ * auVar11._12_4_ + auVar33._12_4_ * auVar33._12_4_ +
         auVar12._12_4_ * auVar12._12_4_;
    auVar64._16_4_ =
         auVar11._16_4_ * auVar11._16_4_ + auVar33._16_4_ * auVar33._16_4_ +
         auVar12._16_4_ * auVar12._16_4_;
    auVar64._20_4_ =
         auVar11._20_4_ * auVar11._20_4_ + auVar33._20_4_ * auVar33._20_4_ +
         auVar12._20_4_ * auVar12._20_4_;
    auVar64._24_4_ =
         auVar11._24_4_ * auVar11._24_4_ + auVar33._24_4_ * auVar33._24_4_ +
         auVar12._24_4_ * auVar12._24_4_;
    auVar64._28_4_ = auVar11._28_4_ + auVar33._28_4_ + auVar12._28_4_;
    auVar14._4_4_ = auVar57._4_4_ * auVar57._4_4_;
    auVar14._0_4_ = auVar57._0_4_ * auVar57._0_4_;
    auVar14._8_4_ = auVar57._8_4_ * auVar57._8_4_;
    auVar14._12_4_ = auVar57._12_4_ * auVar57._12_4_;
    auVar14._16_4_ = auVar57._16_4_ * auVar57._16_4_;
    auVar14._20_4_ = auVar57._20_4_ * auVar57._20_4_;
    auVar14._24_4_ = auVar57._24_4_ * auVar57._24_4_;
    auVar14._28_4_ = auVar12._28_4_;
    auVar12 = vcmpps_avx(auVar64,auVar14,2);
    auVar11 = auVar25 & auVar12;
    if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0x7f,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar11 >> 0xbf,0) != '\0') ||
        (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar11[0x1f] < '\0')
    {
      auVar25 = vandps_avx(auVar25,auVar12);
      auVar34._0_4_ = fVar32 * fVar32 + fVar41 * fVar41 + fVar48 * fVar48;
      auVar34._4_4_ = fVar35 * fVar35 + fVar42 * fVar42 + fVar51 * fVar51;
      auVar34._8_4_ = fVar36 * fVar36 + fVar43 * fVar43 + fVar52 * fVar52;
      auVar34._12_4_ = fVar37 * fVar37 + fVar44 * fVar44 + fVar53 * fVar53;
      auVar34._16_4_ = fVar38 * fVar38 + fVar45 * fVar45 + fVar54 * fVar54;
      auVar34._20_4_ = fVar39 * fVar39 + fVar46 * fVar46 + fVar55 * fVar55;
      auVar34._24_4_ = fVar40 * fVar40 + fVar47 * fVar47 + fVar56 * fVar56;
      auVar34._28_4_ = auVar24._28_4_ + auVar29._28_4_ + auVar31._28_4_;
      auVar12 = vcmpps_avx(auVar34,auVar14,6);
      auVar24 = auVar25 & auVar12;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') {
        local_2c0 = vandps_avx(auVar12,auVar25);
        local_220 = ZEXT1232(ZEXT412(0)) << 0x20;
        local_240 = local_220;
        local_1e0[0] = -fVar2;
        local_1e0[1] = -fVar2;
        local_1e0[2] = -fVar2;
        local_1e0[3] = -fVar2;
        fStack_1d0 = -fVar2;
        fStack_1cc = -fVar2;
        fStack_1c8 = -fVar2;
        fStack_1c4 = -fVar2;
        local_1c0[0] = -fVar3;
        local_1c0[1] = -fVar3;
        local_1c0[2] = -fVar3;
        local_1c0[3] = -fVar3;
        fStack_1b0 = -fVar3;
        fStack_1ac = -fVar3;
        fStack_1a8 = -fVar3;
        fStack_1a4 = -fVar3;
        local_1a0[0] = -fVar4;
        local_1a0[1] = -fVar4;
        local_1a0[2] = -fVar4;
        local_1a0[3] = -fVar4;
        fStack_190 = -fVar4;
        fStack_18c = -fVar4;
        fStack_188 = -fVar4;
        fStack_184 = -fVar4;
        auVar49._8_4_ = 0x7f800000;
        auVar49._0_8_ = 0x7f8000007f800000;
        auVar49._12_4_ = 0x7f800000;
        auVar49._16_4_ = 0x7f800000;
        auVar49._20_4_ = 0x7f800000;
        auVar49._24_4_ = 0x7f800000;
        auVar49._28_4_ = 0x7f800000;
        auVar50 = ZEXT3264(auVar49);
        auVar25 = vblendvps_avx(auVar49,local_200,local_2c0);
        auVar12 = vshufps_avx(auVar25,auVar25,0xb1);
        auVar12 = vminps_avx(auVar25,auVar12);
        auVar24 = vshufpd_avx(auVar12,auVar12,5);
        auVar12 = vminps_avx(auVar12,auVar24);
        auVar24 = vperm2f128_avx(auVar12,auVar12,1);
        auVar12 = vminps_avx(auVar12,auVar24);
        auVar12 = vcmpps_avx(auVar25,auVar12,0);
        auVar24 = local_2c0 & auVar12;
        auVar25 = local_2c0;
        if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0x7f,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0xbf,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar24[0x1f] < '\0') {
          auVar25 = vandps_avx(auVar12,local_2c0);
        }
        uVar18 = vmovmskps_avx(auVar25);
        uVar20 = 1 << ((byte)k & 0x1f);
        uVar19 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        uVar22 = (ulong)((uVar20 & 0xf) << 4);
        lVar21 = (long)((int)uVar20 >> 4) * 0x10;
        auVar25 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar25 = vcmpps_avx(auVar25,auVar25,0xf);
        auVar60 = ZEXT3264(auVar25);
        auVar65 = ZEXT464(0) << 0x20;
        do {
          local_2f0.hit = local_180;
          local_2f0.valid = (int *)&local_320;
          uVar23 = (ulong)uVar19;
          uVar19 = *(uint *)(local_260 + uVar23 * 4);
          pGVar7 = (pSVar6->geometries).items[uVar19].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            *(undefined4 *)(local_2c0 + uVar23 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar1 = *(undefined4 *)(local_240 + uVar23 * 4);
              uVar5 = *(undefined4 *)(local_220 + uVar23 * 4);
              *(float *)(ray + k * 4 + 0x100) = local_1e0[uVar23 - 8];
              *(float *)(ray + k * 4 + 0x180) = local_1e0[uVar23];
              *(float *)(ray + k * 4 + 0x1a0) = local_1c0[uVar23];
              *(float *)(ray + k * 4 + 0x1c0) = local_1a0[uVar23];
              *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar5;
              *(uint *)(ray + k * 4 + 0x220) = (Disc->primIDs).field_0.i[uVar23];
              *(uint *)(ray + k * 4 + 0x240) = uVar19;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              return;
            }
            local_120 = *(undefined4 *)(local_240 + uVar23 * 4);
            local_100 = *(undefined4 *)(local_220 + uVar23 * 4);
            local_e0 = (Disc->primIDs).field_0.i[uVar23];
            fVar2 = local_1e0[uVar23];
            fVar3 = local_1c0[uVar23];
            local_160._4_4_ = fVar3;
            local_160._0_4_ = fVar3;
            local_160._8_4_ = fVar3;
            local_160._12_4_ = fVar3;
            local_160._16_4_ = fVar3;
            local_160._20_4_ = fVar3;
            local_160._24_4_ = fVar3;
            local_160._28_4_ = fVar3;
            auStack_b0 = vpshufd_avx(ZEXT416(uVar19),0);
            fVar3 = local_1a0[uVar23];
            local_140._4_4_ = fVar3;
            local_140._0_4_ = fVar3;
            local_140._8_4_ = fVar3;
            local_140._12_4_ = fVar3;
            local_140._16_4_ = fVar3;
            local_140._20_4_ = fVar3;
            local_140._24_4_ = fVar3;
            local_140._28_4_ = fVar3;
            local_180[0] = (RTCHitN)SUB41(fVar2,0);
            local_180[1] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[2] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[3] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[4] = (RTCHitN)SUB41(fVar2,0);
            local_180[5] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[6] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[7] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[8] = (RTCHitN)SUB41(fVar2,0);
            local_180[9] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[10] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[0xb] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[0xc] = (RTCHitN)SUB41(fVar2,0);
            local_180[0xd] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[0xe] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[0xf] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[0x10] = (RTCHitN)SUB41(fVar2,0);
            local_180[0x11] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[0x12] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[0x13] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[0x14] = (RTCHitN)SUB41(fVar2,0);
            local_180[0x15] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[0x16] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[0x17] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[0x18] = (RTCHitN)SUB41(fVar2,0);
            local_180[0x19] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[0x1a] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[0x1b] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[0x1c] = (RTCHitN)SUB41(fVar2,0);
            local_180[0x1d] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[0x1e] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[0x1f] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            uStack_11c = local_120;
            uStack_118 = local_120;
            uStack_114 = local_120;
            uStack_110 = local_120;
            uStack_10c = local_120;
            uStack_108 = local_120;
            uStack_104 = local_120;
            uStack_fc = local_100;
            uStack_f8 = local_100;
            uStack_f4 = local_100;
            uStack_f0 = local_100;
            uStack_ec = local_100;
            uStack_e8 = local_100;
            uStack_e4 = local_100;
            uStack_dc = local_e0;
            uStack_d8 = local_e0;
            uStack_d4 = local_e0;
            uStack_d0 = local_e0;
            uStack_cc = local_e0;
            uStack_c8 = local_e0;
            uStack_c4 = local_e0;
            local_c0 = auStack_b0;
            local_2a0 = auVar60._0_32_;
            uStack_9c = context->user->instID[0];
            local_a0 = uStack_9c;
            uStack_98 = uStack_9c;
            uStack_94 = uStack_9c;
            uStack_90 = uStack_9c;
            uStack_8c = uStack_9c;
            uStack_88 = uStack_9c;
            uStack_84 = uStack_9c;
            uStack_7c = context->user->instPrimID[0];
            local_80 = uStack_7c;
            uStack_78 = uStack_7c;
            uStack_74 = uStack_7c;
            uStack_70 = uStack_7c;
            uStack_6c = uStack_7c;
            uStack_68 = uStack_7c;
            uStack_64 = uStack_7c;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            *(float *)(ray + k * 4 + 0x100) = local_1e0[uVar23 - 8];
            local_320 = *(undefined8 *)(mm_lookupmask_ps + uVar22);
            uStack_318 = *(undefined8 *)(mm_lookupmask_ps + uVar22 + 8);
            local_310 = *(undefined8 *)(mm_lookupmask_ps + lVar21);
            uStack_308 = *(undefined8 *)(mm_lookupmask_ps + lVar21 + 8);
            local_2f0.geometryUserPtr = pGVar7->userPtr;
            local_2f0.context = context->user;
            local_2f0.N = 8;
            local_2f0.ray = (RTCRayN *)ray;
            if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              local_280 = auVar69._0_32_;
              local_2f8 = Disc;
              (*pGVar7->intersectionFilterN)(&local_2f0);
              auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar60 = ZEXT3264(local_2a0);
              auVar50 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar69 = ZEXT3264(local_280);
              Disc = local_2f8;
            }
            auVar66._8_8_ = uStack_318;
            auVar66._0_8_ = local_320;
            auVar66 = vpcmpeqd_avx(auVar65._0_16_,auVar66);
            auVar10._8_8_ = uStack_308;
            auVar10._0_8_ = local_310;
            auVar10 = vpcmpeqd_avx(auVar65._0_16_,auVar10);
            auVar26._16_16_ = auVar10;
            auVar26._0_16_ = auVar66;
            local_2a0 = auVar60._0_32_;
            auVar25 = local_2a0 & ~auVar26;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar25 >> 0x7f,0) == '\0') &&
                  (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0xbf,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar25[0x1f]) {
              auVar27._0_4_ = auVar60._0_4_ ^ auVar66._0_4_;
              auVar27._4_4_ = auVar60._4_4_ ^ auVar66._4_4_;
              auVar27._8_4_ = auVar60._8_4_ ^ auVar66._8_4_;
              auVar27._12_4_ = auVar60._12_4_ ^ auVar66._12_4_;
              auVar27._16_4_ = auVar60._16_4_ ^ auVar10._0_4_;
              auVar27._20_4_ = auVar60._20_4_ ^ auVar10._4_4_;
              auVar27._24_4_ = auVar60._24_4_ ^ auVar10._8_4_;
              auVar27._28_4_ = auVar60._28_4_ ^ auVar10._12_4_;
            }
            else {
              p_Var9 = context->args->filter;
              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                local_280 = auVar69._0_32_;
                (*p_Var9)(&local_2f0);
                auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar60 = ZEXT3264(local_2a0);
                auVar50 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar69 = ZEXT3264(local_280);
              }
              auVar15._8_8_ = uStack_318;
              auVar15._0_8_ = local_320;
              auVar66 = vpcmpeqd_avx(auVar65._0_16_,auVar15);
              auVar16._8_8_ = uStack_308;
              auVar16._0_8_ = local_310;
              auVar10 = vpcmpeqd_avx(auVar65._0_16_,auVar16);
              auVar30._16_16_ = auVar10;
              auVar30._0_16_ = auVar66;
              auVar27._0_4_ = auVar60._0_4_ ^ auVar66._0_4_;
              auVar27._4_4_ = auVar60._4_4_ ^ auVar66._4_4_;
              auVar27._8_4_ = auVar60._8_4_ ^ auVar66._8_4_;
              auVar27._12_4_ = auVar60._12_4_ ^ auVar66._12_4_;
              auVar27._16_4_ = auVar60._16_4_ ^ auVar10._0_4_;
              auVar27._20_4_ = auVar60._20_4_ ^ auVar10._4_4_;
              auVar27._24_4_ = auVar60._24_4_ ^ auVar10._8_4_;
              auVar27._28_4_ = auVar60._28_4_ ^ auVar10._12_4_;
              auVar25 = auVar60._0_32_ & ~auVar30;
              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0x7f,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0xbf,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar25[0x1f] < '\0') {
                auVar25 = vmaskmovps_avx(auVar27,*(undefined1 (*) [32])local_2f0.hit);
                *(undefined1 (*) [32])(local_2f0.ray + 0x180) = auVar25;
                auVar25 = vmaskmovps_avx(auVar27,*(undefined1 (*) [32])(local_2f0.hit + 0x20));
                *(undefined1 (*) [32])(local_2f0.ray + 0x1a0) = auVar25;
                auVar25 = vmaskmovps_avx(auVar27,*(undefined1 (*) [32])(local_2f0.hit + 0x40));
                *(undefined1 (*) [32])(local_2f0.ray + 0x1c0) = auVar25;
                auVar25 = vmaskmovps_avx(auVar27,*(undefined1 (*) [32])(local_2f0.hit + 0x60));
                *(undefined1 (*) [32])(local_2f0.ray + 0x1e0) = auVar25;
                auVar25 = vmaskmovps_avx(auVar27,*(undefined1 (*) [32])(local_2f0.hit + 0x80));
                *(undefined1 (*) [32])(local_2f0.ray + 0x200) = auVar25;
                auVar25 = vmaskmovps_avx(auVar27,*(undefined1 (*) [32])(local_2f0.hit + 0xa0));
                *(undefined1 (*) [32])(local_2f0.ray + 0x220) = auVar25;
                auVar25 = vmaskmovps_avx(auVar27,*(undefined1 (*) [32])(local_2f0.hit + 0xc0));
                *(undefined1 (*) [32])(local_2f0.ray + 0x240) = auVar25;
                auVar25 = vmaskmovps_avx(auVar27,*(undefined1 (*) [32])(local_2f0.hit + 0xe0));
                *(undefined1 (*) [32])(local_2f0.ray + 0x260) = auVar25;
                auVar25 = vmaskmovps_avx(auVar27,*(undefined1 (*) [32])(local_2f0.hit + 0x100));
                *(undefined1 (*) [32])(local_2f0.ray + 0x280) = auVar25;
              }
            }
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) {
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
            }
            *(undefined4 *)(local_2c0 + uVar23 * 4) = 0;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar28._4_4_ = uVar1;
            auVar28._0_4_ = uVar1;
            auVar28._8_4_ = uVar1;
            auVar28._12_4_ = uVar1;
            auVar28._16_4_ = uVar1;
            auVar28._20_4_ = uVar1;
            auVar28._24_4_ = uVar1;
            auVar28._28_4_ = uVar1;
            auVar25 = vcmpps_avx(auVar69._0_32_,auVar28,2);
            local_2c0 = vandps_avx(auVar25,local_2c0);
          }
          if ((((((((local_2c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_2c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_2c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_2c0 >> 0x7f,0) == '\0') &&
                (local_2c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_2c0 >> 0xbf,0) == '\0') &&
              (local_2c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_2c0[0x1f]) {
            return;
          }
          auVar25 = vblendvps_avx(auVar50._0_32_,auVar69._0_32_,local_2c0);
          auVar12 = vshufps_avx(auVar25,auVar25,0xb1);
          auVar12 = vminps_avx(auVar25,auVar12);
          auVar24 = vshufpd_avx(auVar12,auVar12,5);
          auVar12 = vminps_avx(auVar12,auVar24);
          auVar24 = vperm2f128_avx(auVar12,auVar12,1);
          auVar12 = vminps_avx(auVar12,auVar24);
          auVar12 = vcmpps_avx(auVar25,auVar12,0);
          auVar24 = local_2c0 & auVar12;
          auVar25 = local_2c0;
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0x7f,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0xbf,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar24[0x1f] < '\0') {
            auVar25 = vandps_avx(auVar12,local_2c0);
          }
          uVar18 = vmovmskps_avx(auVar25);
          uVar19 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }